

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<2> * __thiscall
wasm::Literal::getLanesF64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  Literal *this_00;
  long lVar1;
  Literal local_40;
  
  getLanesI64x2(__return_storage_ptr__,this);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)((long)&__return_storage_ptr__->_M_elems[0].field_0 + lVar1);
    castToF64(&local_40,this_00);
    if (this_00 != &local_40) {
      ~Literal(this_00);
      Literal(this_00,&local_40);
    }
    ~Literal(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

LaneArray<2> Literal::getLanesF64x2() const {
  auto lanes = getLanesI64x2();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF64();
  }
  return lanes;
}